

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O0

size_t secp256k1_scratch_max_allocation
                 (secp256k1_callback *error_callback,secp256k1_scratch *scratch,size_t objects)

{
  int iVar1;
  secp256k1_callback *in_RDX;
  void *in_RSI;
  char *in_stack_ffffffffffffffd8;
  size_t local_8;
  
  iVar1 = secp256k1_memcmp_var(in_RSI,"scratch",8);
  if (iVar1 == 0) {
    if (in_RDX < (secp256k1_callback *)0x1111111111111112) {
      if ((ulong)((long)in_RDX * 0xf) <
          (ulong)(*(long *)((long)in_RSI + 0x18) - *(long *)((long)in_RSI + 0x10))) {
        local_8 = (*(long *)((long)in_RSI + 0x18) - *(long *)((long)in_RSI + 0x10)) +
                  (long)in_RDX * -0xf;
      }
      else {
        local_8 = 0;
      }
    }
    else {
      local_8 = 0;
    }
  }
  else {
    secp256k1_callback_call(in_RDX,in_stack_ffffffffffffffd8);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t secp256k1_scratch_max_allocation(const secp256k1_callback* error_callback, const secp256k1_scratch* scratch, size_t objects) {
    if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
        secp256k1_callback_call(error_callback, "invalid scratch space");
        return 0;
    }
    /* Ensure that multiplication will not wrap around */
    if (ALIGNMENT > 1 && objects > SIZE_MAX/(ALIGNMENT - 1)) {
        return 0;
    }
    if (scratch->max_size - scratch->alloc_size <= objects * (ALIGNMENT - 1)) {
        return 0;
    }
    return scratch->max_size - scratch->alloc_size - objects * (ALIGNMENT - 1);
}